

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

AverageLayerParams * __thiscall
CoreML::Specification::AverageLayerParams::New(AverageLayerParams *this,Arena *arena)

{
  AverageLayerParams *this_00;
  
  this_00 = (AverageLayerParams *)operator_new(0x18);
  AverageLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::AverageLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

AverageLayerParams* AverageLayerParams::New(::google::protobuf::Arena* arena) const {
  AverageLayerParams* n = new AverageLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}